

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
                 (char *begin,char *end,
                 id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
                 *handler)

{
  byte bVar1;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *pfVar2;
  uint id;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  basic_string_view<char> name;
  byte *local_40;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_38;
  type local_28;
  
  bVar1 = *begin;
  local_40 = (byte *)begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    pfVar2 = handler->handler;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    next_arg((format_arg *)&local_38.string,&pfVar2->context);
    (pfVar2->arg).type_ = local_28;
    (pfVar2->arg).value_.field_0.long_long_value = local_38.long_long_value;
    (pfVar2->arg).value_.field_0.string.size = local_38.string.size;
  }
  else {
    if ((byte)(bVar1 - 0x30) < 10) {
      id = parse_nonnegative_int<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>&>
                     ((char **)&local_40,end,handler);
      if ((local_40 != (byte *)end) && ((*local_40 == 0x3a || (*local_40 == 0x7d)))) {
        format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::on_arg_id(handler->handler,id);
        return (char *)local_40;
      }
    }
    else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pbVar4 = (byte *)(begin + 1);
      do {
        pbVar3 = pbVar4;
        pbVar5 = (byte *)end;
        if (pbVar3 == (byte *)end) break;
        bVar1 = *pbVar3;
        pbVar4 = pbVar3 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar5 = pbVar3, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      name.size_ = (long)pbVar5 - (long)begin;
      pfVar2 = handler->handler;
      name.data_ = begin;
      basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
      ::get_arg((format_arg *)&local_38.string,&pfVar2->context,name);
      (pfVar2->arg).type_ = local_28;
      (pfVar2->arg).value_.field_0.long_long_value = local_38.long_long_value;
      (pfVar2->arg).value_.field_0.string.size = local_38.string.size;
      return (char *)pbVar5;
    }
    id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
    ::on_error(handler,"invalid format string");
  }
  return (char *)local_40;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}